

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.h
# Opt level: O0

int __thiscall UniValue::getInt<int>(UniValue *this)

{
  long lVar1;
  char *pcVar2;
  size_type sVar3;
  runtime_error *this_00;
  int *in_RDI;
  long in_FS_OFFSET;
  __integer_from_chars_result_type<int> _Var4;
  char *first_nonmatching;
  int result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  int __base;
  char *in_stack_ffffffffffffffb8;
  VType *in_stack_ffffffffffffffc8;
  UniValue *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  int local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  checkType(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     (in_stack_ffffffffffffff88);
  __base = (int)((ulong)pcVar2 >> 0x20);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
            (in_stack_ffffffffffffff88);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
            (in_stack_ffffffffffffff88);
  _Var4 = std::from_chars<int>(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffb8,in_RDI,__base);
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     (in_stack_ffffffffffffff88);
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_stack_ffffffffffffff88);
  if ((_Var4.ptr == pcVar2 + sVar3) && (_Var4.ec == 0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return local_10;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"JSON integer out of range");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

Int UniValue::getInt() const
{
    static_assert(std::is_integral<Int>::value);
    checkType(VNUM);
    Int result;
    const auto [first_nonmatching, error_condition] = std::from_chars(val.data(), val.data() + val.size(), result);
    if (first_nonmatching != val.data() + val.size() || error_condition != std::errc{}) {
        throw std::runtime_error("JSON integer out of range");
    }
    return result;
}